

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

void xmlTextReaderValidateCData(xmlTextReaderPtr reader,xmlChar *data,int len)

{
  uint uVar1;
  int iVar2;
  int ret;
  int len_local;
  xmlChar *data_local;
  xmlTextReaderPtr reader_local;
  
  if (((reader->validate == XML_TEXTREADER_VALIDATE_DTD) && (reader->ctxt != (xmlParserCtxtPtr)0x0))
     && (reader->ctxt->validate == 1)) {
    uVar1 = xmlValidatePushCData(&reader->ctxt->vctxt,data,len);
    reader->ctxt->valid = uVar1 & reader->ctxt->valid;
  }
  if (((reader->validate == XML_TEXTREADER_VALIDATE_RNG) &&
      (reader->rngValidCtxt != (xmlRelaxNGValidCtxtPtr)0x0)) &&
     ((reader->rngFullNode == (xmlNodePtr)0x0 &&
      (iVar2 = xmlRelaxNGValidatePushCData(reader->rngValidCtxt,data,len), iVar2 != 1)))) {
    reader->rngValidErrors = reader->rngValidErrors + 1;
  }
  return;
}

Assistant:

static void
xmlTextReaderValidateCData(xmlTextReaderPtr reader,
                           const xmlChar *data, int len) {
#ifdef LIBXML_VALID_ENABLED
    if ((reader->validate == XML_TEXTREADER_VALIDATE_DTD) &&
        (reader->ctxt != NULL) && (reader->ctxt->validate == 1)) {
	reader->ctxt->valid &= xmlValidatePushCData(&reader->ctxt->vctxt,
	                                            data, len);
    }
#endif /* LIBXML_VALID_ENABLED */
#ifdef LIBXML_SCHEMAS_ENABLED
    if ((reader->validate == XML_TEXTREADER_VALIDATE_RNG) &&
               (reader->rngValidCtxt != NULL)) {
	int ret;

	if (reader->rngFullNode != NULL) return;
	ret = xmlRelaxNGValidatePushCData(reader->rngValidCtxt, data, len);
	if (ret != 1)
	    reader->rngValidErrors++;
    }
#endif
}